

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O1

void aGLTextureUpdate(AGLTexture *tex,AGLTextureData *data)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  code *pcVar5;
  undefined8 local_38;
  
  if (data->type != tex->type) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x42d,"data->type == tex->type");
    aAppTerminate(-1);
  }
  bVar1 = true;
  switch(data->format) {
  case AGLTF_Unknown:
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x3d5,"!\"Unknown format\"");
    aAppTerminate(-1);
  default:
    local_38 = 0;
    uVar2 = 0;
    uVar3 = 0;
    goto LAB_00103da3;
  case AGLTF_U8_R:
    uVar3 = 0x1909;
    uVar2 = 0x190900000000;
    goto LAB_00103d3b;
  case AGLTF_U8_RA:
    uVar3 = 0x190a;
    uVar2 = 0x190a00000000;
LAB_00103d3b:
    local_38 = 0x1401;
    goto LAB_00103da0;
  case AGLTF_U8_RGB:
    local_38 = 0x1401;
    goto LAB_00103d4d;
  case AGLTF_U8_RGBA:
    uVar3 = 0x1908;
    local_38 = 0x1401;
    break;
  case AGLTF_U565_RGB:
    local_38 = 0x8363;
LAB_00103d4d:
    uVar3 = 0x1907;
    uVar2 = 0x190700000000;
    goto LAB_00103da0;
  case AGLTF_U5551_RGBA:
    uVar3 = 0x1908;
    local_38 = 0x8034;
    break;
  case AGLTF_U4444_RGBA:
    uVar3 = 0x1908;
    local_38 = 0x8033;
    break;
  case AGLTF_F32_R:
    uVar3 = 0x822e;
    uVar2 = 0x190300000000;
    local_38 = 0x1406;
    goto LAB_00103da0;
  case AGLTF_F32_RGBA:
    uVar3 = 0x8814;
    local_38 = 0x1406;
  }
  uVar2 = 0x190800000000;
LAB_00103da0:
  bVar1 = false;
LAB_00103da3:
  if (bVar1) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x3d7,"tf.internal != 0");
    aAppTerminate(-1);
  }
  bVar1 = true;
  switch(data->type) {
  case AGLTT_NULL:
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x445,"!\"Invalid texture type\"");
    aAppTerminate(-1);
  default:
    uVar4 = 0;
    pcVar5 = (code *)0x0;
    goto LAB_00103e73;
  case AGLTT_1D:
    pcVar5 = a__GLTexureUpload1D;
    uVar4 = 0xde0;
    break;
  case AGLTT_2D:
    pcVar5 = a__GLTexureUpload2D;
    uVar4 = 0xde1;
    break;
  case AGLTT_3D:
    pcVar5 = a__GLTexureUpload3D;
    uVar4 = 0x806f;
    break;
  case AGLTT_2DArray:
    pcVar5 = a__GLTexureUpload3D;
    uVar4 = 0x8c1a;
  }
  bVar1 = false;
LAB_00103e73:
  if (bVar1) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x447,"upload_func");
    aAppTerminate(-1);
  }
  glBindTexture(uVar4,(tex->_).name);
  (*pcVar5)(tex,data,uVar4,uVar3 | uVar2,local_38);
  if ((data->pixels != (void *)0x0) && ((data->flags & 1) != 0)) {
    glGenerateMipmap(uVar4);
  }
  tex->format = data->format;
  return;
}

Assistant:

void aGLTextureUpdate(AGLTexture *tex, const AGLTextureData *data) {
	ATTO_ASSERT(data->type == tex->type);

	struct A__GLTextureFormat tf = getTextureFormat(data->format);

	a__gl_texture_upload_func *upload_func = NULL;
	GLenum binding = 0;

	switch (data->type) {
		case AGLTT_1D:
			upload_func = &a__GLTexureUpload1D;
			binding = GL_TEXTURE_1D;
			break;
		case AGLTT_2D:
			upload_func = &a__GLTexureUpload2D;
			binding = GL_TEXTURE_2D;
			break;
		case AGLTT_3D:
			upload_func = &a__GLTexureUpload3D;
			binding = GL_TEXTURE_3D;
			break;
		case AGLTT_2DArray:
			upload_func = &a__GLTexureUpload3D;
			binding = GL_TEXTURE_2D_ARRAY;
			break;
		case AGLTT_NULL: ATTO_ASSERT(!"Invalid texture type");
	}
	ATTO_ASSERT(upload_func);

	// TODO track bindings properly
	AGL__CALL(glBindTexture(binding, tex->_.name));

	upload_func(tex, data, binding, tf);

	if (data->pixels && (data->flags & AGLTUF_GenerateMipmaps))
		AGL__CALL(glGenerateMipmap(binding));

	tex->format = data->format;
}